

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O1

void __thiscall OIDType::OIDType(OIDType *this,string *value)

{
  pointer pcVar1;
  bool bVar2;
  
  (this->super_BER_CONTAINER)._type = OID;
  (this->super_BER_CONTAINER)._length = 0;
  (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OIDType_001a46e0;
  this->valid = false;
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_value,pcVar1,pcVar1 + value->_M_string_length);
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = generateInternalData(this);
  this->valid = bVar2;
  return;
}

Assistant:

explicit OIDType(const std::string& value): BER_CONTAINER(OID), _value(value) {
        // When creating a user OID, we generate our data vector immediately
        this->valid = this->generateInternalData();
    }